

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodOptions::SharedCtor(MethodOptions *this)

{
  MethodOptions *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->deprecated_,0,8);
  return;
}

Assistant:

void MethodOptions::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&deprecated_, 0, reinterpret_cast<char*>(&idempotency_level_) -
    reinterpret_cast<char*>(&deprecated_) + sizeof(idempotency_level_));
}